

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O1

void __thiscall
sptk::reaper::LpcAnalyzer::PcToAutocorPc(LpcAnalyzer *this,float *a,float *b,float *c,int p)

{
  float *pfVar1;
  float fVar2;
  float *ap;
  long lVar3;
  ulong uVar4;
  int iVar5;
  float *pfVar6;
  float fVar7;
  
  fVar7 = 1.0;
  if (p != 0) {
    lVar3 = 0;
    do {
      fVar7 = fVar7 + a[lVar3] * a[lVar3];
      lVar3 = lVar3 + 1;
    } while (p != (int)lVar3);
  }
  *c = fVar7;
  if (0 < p) {
    uVar4 = 1;
    lVar3 = 4;
    do {
      fVar7 = a[uVar4 - 1];
      if (uVar4 != (uint)p) {
        iVar5 = p - (int)uVar4;
        pfVar6 = a;
        do {
          fVar2 = *pfVar6;
          pfVar1 = (float *)((long)pfVar6 + lVar3);
          pfVar6 = pfVar6 + 1;
          fVar7 = fVar7 + fVar2 * *pfVar1;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      *b = fVar7 + fVar7;
      b = b + 1;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 4;
    } while (uVar4 != p + 1);
  }
  return;
}

Assistant:

void LpcAnalyzer::PcToAutocorPc(float* a, float* b, float* c, int p) {
  float  s, *ap, *a0;
  int  i, j;

  for (s = 1., ap = a, i = p; i--; ap++)
    s += *ap * *ap;

  *c = s;
  for (i = 1; i <= p; i++) {
    s = a[i - 1];
    for (a0 = a, ap = a + i, j = p - i; j--;)
      s += (*a0++ * *ap++);
    *b++ = 2.0 * s;
  }
}